

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu_v2.c
# Opt level: O3

MppBuffer h264e_vepu_buf_get_nal_size_table(HalH264eVepuBufs *bufs)

{
  MppBuffer pvVar1;
  MppBuffer buf;
  MppBuffer local_20;
  
  pvVar1 = bufs->nal_size_table;
  local_20 = pvVar1;
  if (((byte)hal_h264e_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","enter %p\n","h264e_vepu_buf_get_nal_size_table",bufs);
  }
  if (pvVar1 == (MppBuffer)0x0) {
    mpp_buffer_get_with_tag
              (bufs->group,&local_20,(long)bufs->nal_tab_size,"hal_h264e_vepu_v2",
               "h264e_vepu_buf_get_nal_size_table");
    if ((local_20 == (MppBuffer)0x0) &&
       (_mpp_log_l(2,"hal_h264e_vepu_v2","Assertion %s failed at %s:%d\n",(char *)0x0,"buf",
                   "h264e_vepu_buf_get_nal_size_table",0x114), (mpp_debug._3_1_ & 0x10) != 0)) {
      abort();
    }
    bufs->nal_size_table = local_20;
    pvVar1 = local_20;
  }
  if (((byte)hal_h264e_debug & 0x10) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","leave %p\n","h264e_vepu_buf_get_nal_size_table",bufs);
    pvVar1 = local_20;
  }
  return pvVar1;
}

Assistant:

MppBuffer h264e_vepu_buf_get_nal_size_table(HalH264eVepuBufs *bufs)
{
    MppBuffer buf = bufs->nal_size_table;

    hal_h264e_dbg_buffer("enter %p\n", bufs);

    if (NULL == buf) {
        mpp_buffer_get(bufs->group, &buf, bufs->nal_tab_size);
        mpp_assert(buf);
        bufs->nal_size_table = buf;
    }

    hal_h264e_dbg_buffer("leave %p\n", bufs);

    return buf;
}